

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

string * __thiscall
ParserProbModelXML::GetVariableComment_abi_cxx11_
          (string *__return_storage_ptr__,ParserProbModelXML *this,xmlNodePtr node)

{
  xmlXPathObjectPtr pxVar1;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_19);
  pxVar1 = GetNodesMatchingExpression(this,(xmlChar *)"Comment",node);
  if (pxVar1 != (xmlXPathObjectPtr)0x0) {
    xmlNodeListGetString(this->_m_doc,(*pxVar1->nodesetval->nodeTab)->children,1);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    xmlXPathFreeObject(pxVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ParserProbModelXML::GetVariableComment(const xmlNodePtr node)
{
    //only works for plain text comments so far.
    string comment = "";
    xmlXPathObjectPtr comment_node = GetNodesMatchingExpression((xmlChar*) "Comment",node);
    if(comment_node != NULL)
    {
        comment = (char*) xmlNodeListGetString(GetDoc(), comment_node->nodesetval->nodeTab[0]->xmlChildrenNode, 1);
        if(DEBUG_PARSE)
        {
            cout << "read comment: " << comment << endl;
        }
        xmlXPathFreeObject (comment_node);
    }
    return comment;
}